

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicStruct::Builder::Builder(Builder *this,StructSchema schema,OrphanBuilder *orphan)

{
  StructSize size;
  OrphanBuilder *orphan_local;
  Builder *this_local;
  StructSchema schema_local;
  
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  size = anon_unknown_70::structSizeFromSchema(schema);
  capnp::_::OrphanBuilder::asStruct(&this->builder,orphan,size);
  return;
}

Assistant:

DynamicStruct::Builder::Builder(StructSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(orphan.asStruct(structSizeFromSchema(schema))) {}